

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::SubmitRegistryStringAndCount
          (DnsStats *this,uint32_t registry_id,uint32_t length,uint8_t *value,uint64_t count)

{
  bool stored;
  DnsHashEntry key;
  
  DnsHashEntry::DnsHashEntry(&key);
  stored = false;
  if (length < 0x40) {
    key.key_type = 1;
    key.registry_id = registry_id;
    key.count = count;
    key.key_length = length;
    memcpy(&key.field_6,value,(ulong)length);
    key.field_6.key_value[length] = '\0';
    BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&key,true,&stored);
  }
  DnsHashEntry::~DnsHashEntry(&key);
  return;
}

Assistant:

void DnsStats::SubmitRegistryStringAndCount(uint32_t registry_id, uint32_t length, uint8_t * value, uint64_t count)
{
    DnsHashEntry key;
    bool stored = false;

    if (length < 64)
    {
        key.count = count;
        key.registry_id = registry_id;
        key.key_length = length;
        key.key_type = 1; /* string */
        memcpy(key.key_value, value, length);
        key.key_value[length] = 0;

        (void)hashTable.InsertOrAdd(&key, true, &stored);
    }
}